

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void terminal_print_arrow(EditLine *el,wchar_t *name)

{
  funckey_t *pfVar1;
  int iVar2;
  funckey_t *arrow;
  wchar_t i;
  wchar_t *name_local;
  EditLine *el_local;
  
  pfVar1 = (el->el_terminal).t_fkey;
  for (arrow._4_4_ = 0; arrow._4_4_ < 7; arrow._4_4_ = arrow._4_4_ + 1) {
    if (((*name == L'\0') || (iVar2 = wcscmp(name,pfVar1[arrow._4_4_].name), iVar2 == 0)) &&
       (pfVar1[arrow._4_4_].type != L'\x02')) {
      keymacro_kprint(el,pfVar1[arrow._4_4_].name,&pfVar1[arrow._4_4_].fun,pfVar1[arrow._4_4_].type)
      ;
    }
  }
  return;
}

Assistant:

libedit_private void
terminal_print_arrow(EditLine *el, const wchar_t *name)
{
	int i;
	funckey_t *arrow = el->el_terminal.t_fkey;

	for (i = 0; i < A_K_NKEYS; i++)
		if (*name == '\0' || wcscmp(name, arrow[i].name) == 0)
			if (arrow[i].type != XK_NOD)
				keymacro_kprint(el, arrow[i].name,
				    &arrow[i].fun, arrow[i].type);
}